

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  char word_b [1024];
  char word_a [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  puts("Please input two words to be displayed vertically:");
  do {
    printf("> ");
    pcVar5 = fgets(local_438,0x400,_stdin);
    if (pcVar5 == (char *)0x0) {
      return 1;
    }
  } while (local_438[0] == '\n');
  do {
    printf("> ");
    pcVar5 = fgets(local_838,0x400,_stdin);
    if (pcVar5 == (char *)0x0) {
      return 1;
    }
  } while (local_838[0] == '\n');
  bVar2 = true;
  lVar6 = 0;
  bVar4 = true;
  do {
    if (bVar4) {
      cVar1 = local_438[lVar6];
      bVar3 = false;
      if ((cVar1 != '\0') && (cVar1 != '\n')) {
        printf("%c ",(ulong)(uint)(int)cVar1);
        bVar3 = bVar4;
      }
    }
    else {
      printf("  ");
      bVar3 = bVar4;
    }
    bVar4 = bVar2;
    if (bVar2) {
      cVar1 = local_838[lVar6];
      bVar4 = false;
      if ((cVar1 != '\0') && (cVar1 != '\n')) {
        putchar((int)cVar1);
        bVar4 = bVar2;
      }
    }
    bVar2 = bVar4;
    putchar(10);
    lVar6 = lVar6 + 1;
    bVar4 = bVar3;
  } while (bVar3 || bVar2);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Please input two words to be displayed vertically:\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  bool keep_printing_a = true;
  bool keep_printing_b = true;
  size_t n = 0;
  do {
    if (keep_printing_a) {
      if (word_a[n] != 0 && word_a[n] != '\n') printf("%c ", word_a[n]);
      else keep_printing_a = false;
    } else {
      printf("  ");
    }

    if (keep_printing_b) {
      if (word_b[n] != 0 && word_b[n] != '\n') printf("%c", word_b[n]);
      else keep_printing_b = false;
    }

    printf("\n");
    n++;
  } while (keep_printing_a || keep_printing_b);

  return 0;
}